

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool pugi::impl::(anonymous_namespace)::strcpy_insitu<char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,char_t *source,
               size_t source_length)

{
  ulong uVar1;
  xml_allocator *this;
  size_t sVar2;
  undefined2 *puVar3;
  undefined2 uVar4;
  ulong size;
  ulong uVar5;
  xml_memory_page *local_38;
  
  if (source_length == 0) {
    uVar5 = *header;
    if ((uVar5 & header_mask) != 0) {
      anon_unknown_0::xml_allocator::deallocate_string
                (*(xml_allocator **)((long)header - (uVar5 >> 8)),*dest);
      uVar5 = *header;
    }
    *dest = (char *)0x0;
    *header = ~header_mask & uVar5;
    return true;
  }
  uVar5 = *header;
  if ((uVar5 & 0x40) == 0 && *dest != (char_t *)0x0) {
    sVar2 = anon_unknown_0::strlength(*dest);
    uVar5 = *header;
    if ((uVar5 & header_mask) == 0) {
      if (source_length <= sVar2) goto LAB_0012e2de;
    }
    else if ((source_length <= sVar2) && ((sVar2 < 0x20 || (sVar2 - source_length < sVar2 >> 1)))) {
LAB_0012e2de:
      memcpy(*dest,source,source_length);
      (*dest)[source_length] = '\0';
      return true;
    }
  }
  this = *(xml_allocator **)((long)header - (uVar5 >> 8));
  uVar1 = source_length + 0xc;
  size = uVar1 & 0xfffffffffffffff8;
  uVar5 = this->_busy_size + size;
  if (uVar5 < 0x7fd9) {
    local_38 = this->_root;
    puVar3 = (undefined2 *)((long)&local_38[1].allocator + this->_busy_size);
    this->_busy_size = uVar5;
  }
  else {
    puVar3 = (undefined2 *)anon_unknown_0::xml_allocator::allocate_memory_oob(this,size,&local_38);
    if (puVar3 == (undefined2 *)0x0) {
      return false;
    }
  }
  if (((long)puVar3 - (long)local_38 & 7U) != 0) {
    __assert_fail("page_offset % xml_memory_block_alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x294,
                  "char_t *pugi::impl::(anonymous namespace)::xml_allocator::allocate_string(size_t)"
                 );
  }
  uVar5 = ((long)puVar3 - (long)local_38) - 0x28;
  if (0x7ffff < uVar5) {
    __assert_fail("page_offset >= 0 && static_cast<size_t>(page_offset) < max_encoded_offset",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x295,
                  "char_t *pugi::impl::(anonymous namespace)::xml_allocator::allocate_string(size_t)"
                 );
  }
  *puVar3 = (short)(uVar5 >> 3);
  if ((0x7ffff < uVar1) && ((uVar5 != 0 || (local_38->busy_size != size)))) {
    __assert_fail("full_size < max_encoded_offset || (page->busy_size == full_size && page_offset == 0)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x29a,
                  "char_t *pugi::impl::(anonymous namespace)::xml_allocator::allocate_string(size_t)"
                 );
  }
  uVar4 = 0;
  if (uVar1 < 0x80000) {
    uVar4 = (short)(uVar1 >> 3);
  }
  puVar3[1] = uVar4;
  memcpy(puVar3 + 2,source,source_length);
  *(undefined1 *)((long)puVar3 + source_length + 4) = 0;
  uVar5 = *header;
  if ((uVar5 & header_mask) != 0) {
    anon_unknown_0::xml_allocator::deallocate_string(this,*dest);
    uVar5 = *header;
  }
  *dest = (char *)(puVar3 + 2);
  *header = uVar5 | header_mask;
  return true;
}

Assistant:

PUGI__FN bool strcpy_insitu(String& dest, Header& header, uintptr_t header_mask, const char_t* source, size_t source_length)
	{
		if (source_length == 0)
		{
			// empty string and null pointer are equivalent, so just deallocate old memory
			xml_allocator* alloc = PUGI__GETPAGE_IMPL(header)->allocator;

			if (header & header_mask) alloc->deallocate_string(dest);

			// mark the string as not allocated
			dest = 0;
			header &= ~header_mask;

			return true;
		}
		else if (dest && strcpy_insitu_allow(source_length, header, header_mask, dest))
		{
			// we can reuse old buffer, so just copy the new data (including zero terminator)
			memcpy(dest, source, source_length * sizeof(char_t));
			dest[source_length] = 0;

			return true;
		}
		else
		{
			xml_allocator* alloc = PUGI__GETPAGE_IMPL(header)->allocator;

			if (!alloc->reserve()) return false;

			// allocate new buffer
			char_t* buf = alloc->allocate_string(source_length + 1);
			if (!buf) return false;

			// copy the string (including zero terminator)
			memcpy(buf, source, source_length * sizeof(char_t));
			buf[source_length] = 0;

			// deallocate old buffer (*after* the above to protect against overlapping memory and/or allocation failures)
			if (header & header_mask) alloc->deallocate_string(dest);

			// the string is now allocated, so set the flag
			dest = buf;
			header |= header_mask;

			return true;
		}
	}